

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

wchar_t scan_distant_floor(object **items,wchar_t max_size,player *p,loc grid)

{
  _Bool _Var1;
  object *obj;
  long lVar2;
  wchar_t wVar3;
  
  _Var1 = square_in_bounds((chunk_conflict *)p->cave,grid);
  wVar3 = L'\0';
  if (_Var1) {
    obj = square_object((chunk_conflict *)p->cave,grid);
    wVar3 = L'\0';
    if (L'\0' < max_size && obj != (object *)0x0) {
      wVar3 = L'\0';
      do {
        if (obj->kind != unknown_item_kind) {
          _Var1 = ignore_known_item_ok(p,obj);
          if (!_Var1) {
            lVar2 = (long)wVar3;
            wVar3 = wVar3 + L'\x01';
            items[lVar2] = cave->objects[obj->oidx];
          }
        }
        obj = obj->next;
      } while ((obj != (object *)0x0) && (wVar3 < max_size));
    }
  }
  return wVar3;
}

Assistant:

int scan_distant_floor(struct object **items, int max_size, struct player *p,
		struct loc grid)
{
	struct object *obj;
	int num = 0;

	/* Sanity */
	if (!square_in_bounds(p->cave, grid)) return 0;

	/* Scan all objects in the grid */
	for (obj = square_object(p->cave, grid); obj; obj = obj->next) {
		/* Enforce limit */
		if (num >= max_size) break;

		/* Known */
		if (obj->kind == unknown_item_kind) continue;

		/* Visible */
		if (ignore_known_item_ok(p, obj)) continue;

		/* Accept this item's base object */
		items[num++] = cave->objects[obj->oidx];
	}

	return num;
}